

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::Install(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmExecutionStatus *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  MatchProperties match_properties_00;
  undefined1 local_a8 [8];
  string newToFile;
  string newFromFile;
  MatchProperties match_properties;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *toFile_local;
  string *fromFile_local;
  cmFileCopier *this_local;
  
  local_28 = toFile;
  toFile_local = fromFile;
  fromFile_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    this_00 = this->Status;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"INSTALL encountered an empty string input file name.",&local_49)
    ;
    cmExecutionStatus::SetError(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_007e75a1;
  }
  match_properties_00 = CollectMatchProperties(this,toFile_local);
  if (((ulong)match_properties_00 & 1) != 0) {
    this_local._7_1_ = 1;
    goto LAB_007e75a1;
  }
  bVar1 = cmsys::SystemTools::SameFile(toFile_local,local_28);
  if (bVar1) {
    this_local._7_1_ = 1;
    goto LAB_007e75a1;
  }
  std::__cxx11::string::string
            ((string *)(newToFile.field_2._M_local_buf + 8),(string *)toFile_local);
  std::__cxx11::string::string((string *)local_a8,(string *)local_28);
  if ((this->FollowSymlinkChain & 1U) == 0) {
LAB_007e7427:
    bVar1 = cmsys::SystemTools::FileIsSymlink((string *)((long)&newToFile.field_2 + 8));
    if (bVar1) {
      this_local._7_1_ =
           InstallSymlink(this,(string *)((long)&newToFile.field_2 + 8),(string *)local_a8);
    }
    else {
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&newToFile.field_2 + 8));
      if (bVar1) {
        this_local._7_1_ =
             InstallDirectory(this,(string *)((long)&newToFile.field_2 + 8),(string *)local_a8,
                              match_properties_00);
      }
      else {
        bVar1 = cmsys::SystemTools::FileExists((string *)((long)&newToFile.field_2 + 8));
        if (bVar1) {
          iVar2 = (*this->_vptr_cmFileCopier[2])
                            (this,(undefined1 *)((long)&newToFile.field_2 + 8),local_a8,
                             match_properties_00);
          this_local._7_1_ = (byte)iVar2 & 1;
        }
        else {
          iVar2 = (*this->_vptr_cmFileCopier[6])(this,(undefined1 *)((long)&newToFile.field_2 + 8));
          this_local._7_1_ = (byte)iVar2 & 1;
        }
      }
    }
  }
  else {
    bVar1 = InstallSymlinkChain(this,(string *)((long)&newToFile.field_2 + 8),(string *)local_a8);
    if (bVar1) goto LAB_007e7427;
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(newToFile.field_2._M_local_buf + 8));
LAB_007e75a1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCopier::Install(const std::string& fromFile,
                           const std::string& toFile)
{
  if (fromFile.empty()) {
    this->Status.SetError(
      "INSTALL encountered an empty string input file name.");
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }

  std::string newFromFile = fromFile;
  std::string newToFile = toFile;

  if (this->FollowSymlinkChain &&
      !this->InstallSymlinkChain(newFromFile, newToFile)) {
    return false;
  }

  if (cmSystemTools::FileIsSymlink(newFromFile)) {
    return this->InstallSymlink(newFromFile, newToFile);
  }
  if (cmSystemTools::FileIsDirectory(newFromFile)) {
    return this->InstallDirectory(newFromFile, newToFile, match_properties);
  }
  if (cmSystemTools::FileExists(newFromFile)) {
    return this->InstallFile(newFromFile, newToFile, match_properties);
  }
  return this->ReportMissing(newFromFile);
}